

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O0

void xercesc_4_0::XTemplateSerializer::loadObject
               (RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher> **objToLoad,
               int param_2,bool toAdopt,XSerializeEngine *serEng)

{
  byte bVar1;
  bool bVar2;
  MemoryManager *pMVar3;
  RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher> *this;
  XMLRefInfo *local_58;
  XMLRefInfo *data;
  XMLCh *key;
  XMLSize_t itemIndex;
  XMLSize_t itemNumber;
  XMLSize_t local_28;
  XMLSize_t hashModulus;
  XSerializeEngine *serEng_local;
  bool toAdopt_local;
  RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher> **ppRStack_10;
  int param_1_local;
  RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher> **objToLoad_local;
  
  hashModulus = (XMLSize_t)serEng;
  serEng_local._3_1_ = toAdopt;
  serEng_local._4_4_ = param_2;
  ppRStack_10 = objToLoad;
  bVar2 = XSerializeEngine::needToLoadObject(serEng,objToLoad);
  if (bVar2) {
    XSerializeEngine::readSize((XSerializeEngine *)hashModulus,&local_28);
    if (*ppRStack_10 == (RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher> *)0x0) {
      pMVar3 = XSerializeEngine::getMemoryManager((XSerializeEngine *)hashModulus);
      this = (RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher> *)
             XMemory::operator_new(0x38,pMVar3);
      bVar1 = serEng_local._3_1_;
      pMVar3 = XSerializeEngine::getMemoryManager((XSerializeEngine *)hashModulus);
      RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher>::RefHashTableOf
                (this,local_28,(bool)(bVar1 & 1),pMVar3);
      *ppRStack_10 = this;
    }
    XSerializeEngine::registerObject((XSerializeEngine *)hashModulus,*ppRStack_10);
    itemIndex = 0;
    XSerializeEngine::readSize((XSerializeEngine *)hashModulus,&itemIndex);
    for (key = (XMLCh *)0x0; key < itemIndex; key = (XMLCh *)((long)key + 1)) {
      XSerializeEngine::readString((XSerializeEngine *)hashModulus,(XMLCh **)&data);
      xercesc_4_0::operator>>((XSerializeEngine *)hashModulus,&local_58);
      RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher>::put
                (*ppRStack_10,data,local_58);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::loadObject(RefHashTableOf<XMLRefInfo>** objToLoad
                                   , int
                                   , bool                         toAdopt
                                   , XSerializeEngine&            serEng)
{
    if (serEng.needToLoadObject((void**)objToLoad))
    {
        XMLSize_t hashModulus;
        serEng.readSize (hashModulus);

        if (!*objToLoad)
        {
            *objToLoad = new (serEng.getMemoryManager())
                             RefHashTableOf<XMLRefInfo>(
                                                        hashModulus
                                                      , toAdopt
                                                      , serEng.getMemoryManager()
                                                      );
        }

        serEng.registerObject(*objToLoad);

        XMLSize_t itemNumber = 0;
        serEng.readSize (itemNumber);

        for (XMLSize_t itemIndex = 0; itemIndex < itemNumber; itemIndex++)
        {
            XMLCh*      key;
            serEng.readString(key);

            XMLRefInfo*  data;
            serEng>>data;

            (*objToLoad)->put((void*)key, data);
        }
    }
}